

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  ulong uVar5;
  int iVar6;
  xmlXPathObjectPtr pxVar7;
  xmlXPathObjectPtr pxVar8;
  xmlChar *val;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  int iStack_60;
  double local_48;
  
  if ((nargs < 2) || (3 < (uint)nargs)) {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    iStack_60 = 0xc;
    goto LAB_001b7521;
  }
  local_48 = 0.0;
  if (nargs == 3) {
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      if (ctxt->value->type != XPATH_NUMBER) {
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER))
        goto LAB_001b751f;
      }
      pxVar7 = valuePop(ctxt);
      local_48 = pxVar7->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar7);
      goto LAB_001b747c;
    }
  }
  else {
LAB_001b747c:
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      if (ctxt->value->type != XPATH_NUMBER) {
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER))
        goto LAB_001b751f;
      }
      pxVar7 = valuePop(ctxt);
      dVar1 = pxVar7->floatval;
      xmlXPathReleaseObject(ctxt->context,pxVar7);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (ctxt->value->type != XPATH_STRING) {
          xmlXPathStringFunction(ctxt,1);
          if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
          goto LAB_001b751f;
        }
        pxVar7 = valuePop(ctxt);
        iVar10 = 0x7fffffff;
        if (dVar1 < 2147483647.0) {
          if (1.0 <= dVar1) {
            iVar10 = (int)dVar1;
            dVar3 = floor(dVar1);
            if (0.5 <= dVar1 - dVar3) {
              iVar10 = iVar10 + 1;
            }
          }
          else {
            iVar10 = 1;
          }
        }
        iVar9 = 0x7ffffffe;
        if (nargs == 3) {
          dVar3 = floor(dVar1);
          dVar4 = floor(local_48);
          uVar11 = -(ulong)(local_48 - dVar4 < 0.5);
          uVar12 = -(ulong)(dVar1 - dVar3 < 0.5);
          uVar5 = (ulong)dVar3 & uVar12;
          auVar13._0_8_ = ~uVar11 & (ulong)(dVar4 + 1.0);
          auVar13._8_8_ = ~uVar12 & (ulong)(dVar3 + 1.0);
          auVar2._8_4_ = (int)uVar5;
          auVar2._0_8_ = (ulong)dVar4 & uVar11;
          auVar2._12_4_ = (int)(uVar5 >> 0x20);
          dVar1 = SUB168(auVar13 | auVar2,8) + SUB168(auVar13 | auVar2,0);
          iVar9 = 0;
          if ((1.0 <= dVar1) && (iVar9 = 0x7ffffffe, dVar1 < 2147483647.0)) {
            iVar9 = (int)dVar1 + -1;
          }
        }
        if (iVar10 <= iVar9) {
          iVar6 = xmlUTF8Strlen(pxVar7->stringval);
          if (iVar10 <= iVar6) {
            val = xmlUTF8Strsub(pxVar7->stringval,iVar10 + -1,iVar9 - (iVar10 + -1));
            if (val == (xmlChar *)0x0) {
              xmlXPathPErrMemory(ctxt);
            }
            pxVar8 = xmlXPathCacheNewString(ctxt,val);
            valuePush(ctxt,pxVar8);
            (*xmlFree)(val);
            goto LAB_001b7672;
          }
        }
        pxVar8 = xmlXPathCacheNewString(ctxt,"");
        valuePush(ctxt,pxVar8);
LAB_001b7672:
        xmlXPathReleaseObject(ctxt->context,pxVar7);
        return;
      }
    }
  }
LAB_001b751f:
  iStack_60 = 0xb;
LAB_001b7521:
  xmlXPathErr(ctxt,iStack_60);
  return;
}

Assistant:

void
xmlXPathSubstringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str, start, len;
    double le=0, in;
    int i = 1, j = INT_MAX;

    if (nargs < 2) {
	CHECK_ARITY(2);
    }
    if (nargs > 3) {
	CHECK_ARITY(3);
    }
    /*
     * take care of possible last (position) argument
    */
    if (nargs == 3) {
	CAST_TO_NUMBER;
	CHECK_TYPE(XPATH_NUMBER);
	len = valuePop(ctxt);
	le = len->floatval;
	xmlXPathReleaseObject(ctxt->context, len);
    }

    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    start = valuePop(ctxt);
    in = start->floatval;
    xmlXPathReleaseObject(ctxt->context, start);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    str = valuePop(ctxt);

    if (!(in < INT_MAX)) { /* Logical NOT to handle NaNs */
        i = INT_MAX;
    } else if (in >= 1.0) {
        i = (int)in;
        if (in - floor(in) >= 0.5)
            i += 1;
    }

    if (nargs == 3) {
        double rin, rle, end;

        rin = floor(in);
        if (in - rin >= 0.5)
            rin += 1.0;

        rle = floor(le);
        if (le - rle >= 0.5)
            rle += 1.0;

        end = rin + rle;
        if (!(end >= 1.0)) { /* Logical NOT to handle NaNs */
            j = 1;
        } else if (end < INT_MAX) {
            j = (int)end;
        }
    }

    i -= 1;
    j -= 1;

    if ((i < j) && (i < xmlUTF8Strlen(str->stringval))) {
        xmlChar *ret = xmlUTF8Strsub(str->stringval, i, j - i);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);
	valuePush(ctxt, xmlXPathCacheNewString(ctxt, ret));
	xmlFree(ret);
    } else {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    }

    xmlXPathReleaseObject(ctxt->context, str);
}